

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O0

Vec_Int_t *
findNewDisjunctiveMonotone
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
          antecedentConsequentVectorsStruct *anteConseVectors)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  void *pvVar4;
  int pendingSignalIndexLocal;
  Abc_Cex_t *cexElem;
  Vec_Int_t *vMonotoneIndex;
  Pdr_Par_t *pPars;
  Pdr_Par_t Pars;
  int local_40;
  int poSerialNum;
  int i;
  int poMarker;
  Aig_Obj_t *pObjTargetPo;
  Aig_Man_t *pAigNew;
  antecedentConsequentVectorsStruct *anteConseVectors_local;
  aigPoIndices *aigPoIndicesArg_local;
  Aig_Man_t *pAig_local;
  
  iVar3 = aigPoIndicesArg->attrPendingSignalIndex;
  pAigNew = (Aig_Man_t *)anteConseVectors;
  anteConseVectors_local = (antecedentConsequentVectorsStruct *)aigPoIndicesArg;
  aigPoIndicesArg_local = (aigPoIndices *)pAig;
  pObjTargetPo = (Aig_Obj_t *)
                 createDisjunctiveMonotoneTester(pAig,aigPoIndicesArg,anteConseVectors,&poSerialNum)
  ;
  p = (Aig_Man_t *)Vec_IntAlloc(0);
  for (local_40 = 0; iVar2 = Saig_ManPoNum((Aig_Man_t *)pObjTargetPo), local_40 < iVar2;
      local_40 = local_40 + 1) {
    _i = Aig_ManCo((Aig_Man_t *)pObjTargetPo,local_40);
    Aig_ObjChild0Flip(_i);
  }
  Pdr_ManSetDefaultParams((Pdr_Par_t *)&pPars);
  Pars.fUseAbs = 0;
  Pars.fVerbose = 1;
  Pars.fNotVerbose = 1;
  pObjTargetPo[8].TravId = 0;
  pObjTargetPo[8].Id = 0;
  Pdr_ManSolve((Aig_Man_t *)pObjTargetPo,(Pdr_Par_t *)&pPars);
  lVar1._0_4_ = pObjTargetPo[8].TravId;
  lVar1._4_4_ = pObjTargetPo[8].Id;
  if (lVar1 != 0) {
    for (local_40 = 0; iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)&pObjTargetPo[8].TravId), local_40 < iVar2
        ; local_40 = local_40 + 1) {
      pvVar4 = Vec_PtrEntry(*(Vec_Ptr_t **)&pObjTargetPo[8].TravId,local_40);
      if ((pvVar4 == (void *)0x0) && (iVar3 + 1 <= local_40)) {
        Pars.pInvFileName._4_4_ = local_40 - (iVar3 + 1);
        iVar2 = Vec_IntEntry((Vec_Int_t *)pAigNew->pSpec,Pars.pInvFileName._4_4_);
        Vec_IntPush((Vec_Int_t *)p,iVar2);
      }
    }
  }
  for (local_40 = 0; iVar3 = Saig_ManPoNum((Aig_Man_t *)pObjTargetPo), local_40 < iVar3;
      local_40 = local_40 + 1) {
    _i = Aig_ManCo((Aig_Man_t *)pObjTargetPo,local_40);
    Aig_ObjChild0Flip(_i);
  }
  Aig_ManStop((Aig_Man_t *)pObjTargetPo);
  iVar3 = Vec_IntSize((Vec_Int_t *)p);
  pAig_local = p;
  if (iVar3 < 1) {
    Vec_IntFree((Vec_Int_t *)p);
    pAig_local = (Aig_Man_t *)0x0;
  }
  return (Vec_Int_t *)pAig_local;
}

Assistant:

Vec_Int_t *findNewDisjunctiveMonotone( Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct antecedentConsequentVectorsStruct *anteConseVectors )
{
    Aig_Man_t *pAigNew;
    Aig_Obj_t *pObjTargetPo;
    int poMarker;
    //int i, RetValue, poSerialNum;
    int i, poSerialNum;
    Pdr_Par_t Pars, * pPars = &Pars;
    //Abc_Cex_t * pCex = NULL;
    Vec_Int_t *vMonotoneIndex;
    //char fileName[20];
    Abc_Cex_t * cexElem;

    int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;

    pAigNew = createDisjunctiveMonotoneTester(pAig, aigPoIndicesArg, anteConseVectors, &poMarker );

    //printf("enter an integer : ");
    //waitForInteger = getchar();
    //putchar(waitForInteger);

    vMonotoneIndex = Vec_IntAlloc(0);

    for( i=0; i<Saig_ManPoNum(pAigNew); i++ )
    {
        pObjTargetPo = Aig_ManCo( pAigNew, i );
        Aig_ObjChild0Flip( pObjTargetPo );
    }

    Pdr_ManSetDefaultParams( pPars );
    pPars->fVerbose = 0;
    pPars->fNotVerbose = 1;
    pPars->fSolveAll = 1;
    pAigNew->vSeqModelVec = NULL;
    Pdr_ManSolve( pAigNew, pPars );    

    if( pAigNew->vSeqModelVec )
    {
        Vec_PtrForEachEntry( Abc_Cex_t *, pAigNew->vSeqModelVec, cexElem, i )
        {
            if( cexElem == NULL  && i >= pendingSignalIndexLocal + 1)
            {
                poSerialNum = i - (pendingSignalIndexLocal + 1);
                Vec_IntPush( vMonotoneIndex, Vec_IntEntry( anteConseVectors->attrConsequentCandidates, poSerialNum ));
            }
        }
    }
    for( i=0; i<Saig_ManPoNum(pAigNew); i++ )
    {
        pObjTargetPo = Aig_ManCo( pAigNew, i );
        Aig_ObjChild0Flip( pObjTargetPo );
    }
    
    //if(pAigNew->vSeqModelVec)
    //    Vec_PtrFree(pAigNew->vSeqModelVec);

    Aig_ManStop(pAigNew);
    
    if( Vec_IntSize( vMonotoneIndex ) > 0 )
    {
        return vMonotoneIndex;
    }
    else
    {
        Vec_IntFree(vMonotoneIndex);
        return NULL;
    }
}